

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O0

int write_wav_header(FILE *f,uint totalFrames)

{
  size_t sVar1;
  UINT8 local_24 [4];
  UINT32 local_20;
  UINT8 tmp [4];
  uint dataSize;
  uint totalFrames_local;
  FILE *f_local;
  
  local_20 = totalFrames * (bit_depth >> 3) * 2;
  tmp = (UINT8  [4])totalFrames;
  sVar1 = fwrite("RIFF",1,4,(FILE *)f);
  if (sVar1 == 4) {
    pack_uint32le(local_24,local_20 + 0x3c);
    sVar1 = fwrite(local_24,1,4,(FILE *)f);
    if (sVar1 == 4) {
      sVar1 = fwrite("WAVE",1,4,(FILE *)f);
      if (sVar1 == 4) {
        sVar1 = fwrite("fmt ",1,4,(FILE *)f);
        if (sVar1 == 4) {
          pack_uint32le(local_24,0x28);
          sVar1 = fwrite(local_24,1,4,(FILE *)f);
          if (sVar1 == 4) {
            pack_uint16le(local_24,0xfffe);
            sVar1 = fwrite(local_24,1,2,(FILE *)f);
            if (sVar1 == 2) {
              pack_uint16le(local_24,2);
              sVar1 = fwrite(local_24,1,2,(FILE *)f);
              if (sVar1 == 2) {
                pack_uint32le(local_24,sample_rate);
                sVar1 = fwrite(local_24,1,4,(FILE *)f);
                if (sVar1 == 4) {
                  pack_uint32le(local_24,sample_rate * 2 * (bit_depth >> 3));
                  sVar1 = fwrite(local_24,1,4,(FILE *)f);
                  if (sVar1 == 4) {
                    pack_uint16le(local_24,(UINT16)((bit_depth >> 3) << 1));
                    sVar1 = fwrite(local_24,1,2,(FILE *)f);
                    if (sVar1 == 2) {
                      pack_uint16le(local_24,(UINT16)bit_depth);
                      sVar1 = fwrite(local_24,1,2,(FILE *)f);
                      if (sVar1 == 2) {
                        pack_uint16le(local_24,0x16);
                        sVar1 = fwrite(local_24,1,2,(FILE *)f);
                        if (sVar1 == 2) {
                          pack_uint16le(local_24,(UINT16)bit_depth);
                          sVar1 = fwrite(local_24,1,2,(FILE *)f);
                          if (sVar1 == 2) {
                            pack_uint32le(local_24,3);
                            sVar1 = fwrite(local_24,1,4,(FILE *)f);
                            if (sVar1 == 4) {
                              pack_uint16le(local_24,1);
                              sVar1 = fwrite(local_24,1,2,(FILE *)f);
                              if (sVar1 == 2) {
                                sVar1 = fwrite(extensible_guid_trailer,1,0xe,(FILE *)f);
                                if (sVar1 == 0xe) {
                                  sVar1 = fwrite("data",1,4,(FILE *)f);
                                  if (sVar1 == 4) {
                                    pack_uint32le(local_24,local_20);
                                    sVar1 = fwrite(local_24,1,4,(FILE *)f);
                                    if (sVar1 == 4) {
                                      f_local._4_4_ = 1;
                                    }
                                    else {
                                      f_local._4_4_ = 0;
                                    }
                                  }
                                  else {
                                    f_local._4_4_ = 0;
                                  }
                                }
                                else {
                                  f_local._4_4_ = 0;
                                }
                              }
                              else {
                                f_local._4_4_ = 0;
                              }
                            }
                            else {
                              f_local._4_4_ = 0;
                            }
                          }
                          else {
                            f_local._4_4_ = 0;
                          }
                        }
                        else {
                          f_local._4_4_ = 0;
                        }
                      }
                      else {
                        f_local._4_4_ = 0;
                      }
                    }
                    else {
                      f_local._4_4_ = 0;
                    }
                  }
                  else {
                    f_local._4_4_ = 0;
                  }
                }
                else {
                  f_local._4_4_ = 0;
                }
              }
              else {
                f_local._4_4_ = 0;
              }
            }
            else {
              f_local._4_4_ = 0;
            }
          }
          else {
            f_local._4_4_ = 0;
          }
        }
        else {
          f_local._4_4_ = 0;
        }
      }
      else {
        f_local._4_4_ = 0;
      }
    }
    else {
      f_local._4_4_ = 0;
    }
  }
  else {
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

static int write_wav_header(FILE *f, unsigned int totalFrames) {
    unsigned int dataSize = totalFrames * (bit_depth / 8) * 2;
    UINT8 tmp[4];
    if(fwrite("RIFF",1,4,f) != 4) return 0;
    pack_uint32le(tmp, 4 + ( 8 + dataSize ) + (8 + 40) );
    if(fwrite(tmp,1,4,f) != 4) return 0;

    if(fwrite("WAVE",1,4,f) != 4) return 0;
    if(fwrite("fmt ",1,4,f) != 4) return 0;

    /* fmtSize
     * 16 = standard wave
     * 40 = extensible
     */
    pack_uint32le(tmp,40);
    if(fwrite(tmp,1,4,f) != 4) return 0;

    /* audioFormat:
     * 1 = PCM
     * 3 = float
     * 6 = alaw
     * 7 = ulaw
     * 0xfffe = extensible */
    pack_uint16le(tmp,0xFFFE);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* numChannels */
    pack_uint16le(tmp,2);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* sampleRate */
    pack_uint32le(tmp,sample_rate);
    if(fwrite(tmp,1,4,f) != 4) return 0;

    /* dataRate (bytes per second) */
    pack_uint32le(tmp,sample_rate * 2 * (bit_depth / 8));
    if(fwrite(tmp,1,4,f) != 4) return 0;

    /* block alignment (channels * sample size) */
    pack_uint16le(tmp,2 * (bit_depth / 8));
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* bits per sample */
    pack_uint16le(tmp,bit_depth);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* size of extended header */
    pack_uint16le(tmp,22);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* number of "valid" bits per sample? */
    pack_uint16le(tmp,bit_depth);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* speaker position mask */
    /* 3 = normal stereo */
    pack_uint32le(tmp,3);
    if(fwrite(tmp,1,4,f) != 4) return 0;

    /* subformatcode - same as above audioFormat */
    pack_uint16le(tmp,1);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* rest of the GUID */
    if(fwrite(extensible_guid_trailer,1,14,f) != 14) return 0;

    if(fwrite("data",1,4,f) != 4) return 0;

    pack_uint32le(tmp,dataSize);
    if(fwrite(tmp,1,4,f) != 4) return 0;

    return 1;
}